

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsPreviewDialog.cpp
# Opt level: O0

void __thiscall
KDReports::PreviewDialog::PreviewDialog(PreviewDialog *this,Report *report,QWidget *parent)

{
  QAbstractButton *pQVar1;
  undefined8 uVar2;
  PreviewDialogPrivate *this_00;
  PreviewWidget *pPVar3;
  pointer pPVar4;
  QVBoxLayout *this_01;
  __uniq_ptr_data<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>,_true,_true>
  this_02;
  QDialogButtonBox *pQVar5;
  QPushButton *pQVar6;
  unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
  *this_03;
  ConnectionType type;
  Object local_160 [15];
  undefined1 local_151;
  QString local_150;
  QPushButton *local_138;
  QPushButton *cancelButton;
  undefined8 local_128;
  PreviewDialog *local_120;
  Object local_118 [15];
  undefined1 local_109;
  QString local_108;
  QPushButton *local_f0;
  QPushButton *saveButton;
  undefined8 local_e0;
  PreviewDialog *local_d8;
  Object local_d0 [15];
  undefined1 local_c1;
  QString local_c0;
  QPushButton *local_a8;
  QPushButton *printWithDialogButton;
  code *local_98;
  undefined8 uStack_90;
  code *local_88;
  undefined8 local_80;
  undefined1 local_78 [16];
  undefined8 local_68;
  PreviewDialog *local_60;
  undefined1 local_58 [16];
  QHBoxLayout *bottomLayout;
  QVBoxLayout *local_40;
  QVBoxLayout *topLayout;
  QFlags<Qt::WindowType> local_24;
  QWidget *local_20;
  QWidget *parent_local;
  Report *report_local;
  PreviewDialog *this_local;
  
  local_20 = parent;
  parent_local = (QWidget *)report;
  report_local = (Report *)this;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  QDialog::QDialog(&this->super_QDialog,parent,(QFlags_conflict1 *)(ulong)local_24.i);
  *(undefined ***)this = &PTR_metaObject_001c7928;
  *(undefined ***)&this->field_0x10 = &PTR__PreviewDialog_001c7b08;
  this_00 = (PreviewDialogPrivate *)operator_new(0x70);
  PreviewDialogPrivate::PreviewDialogPrivate(this_00,this);
  std::
  unique_ptr<KDReports::PreviewDialogPrivate,std::default_delete<KDReports::PreviewDialogPrivate>>::
  unique_ptr<std::default_delete<KDReports::PreviewDialogPrivate>,void>
            ((unique_ptr<KDReports::PreviewDialogPrivate,std::default_delete<KDReports::PreviewDialogPrivate>>
              *)&this->d,this_00);
  pPVar3 = (PreviewWidget *)operator_new(0x30);
  PreviewWidget::PreviewWidget(pPVar3,(QWidget *)this);
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  pPVar4->m_previewWidget = pPVar3;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  PreviewWidget::setReport(pPVar4->m_previewWidget,(Report *)parent_local);
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01,(QWidget *)this);
  local_40 = this_01;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  pPVar3 = pPVar4->m_previewWidget;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&bottomLayout + 4));
  QBoxLayout::addWidget((QWidget *)this_01,(int)pPVar3,(QFlags_conflict1 *)0x0);
  this_02.
  super___uniq_ptr_impl<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
  ._M_t.
  super__Tuple_impl<0UL,_KDReports::PreviewWidgetPrivate_*,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
  .super__Head_base<0UL,_KDReports::PreviewWidgetPrivate_*,_false>._M_head_impl =
       (__uniq_ptr_impl<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
        )operator_new(0x20);
  QHBoxLayout::QHBoxLayout
            ((QHBoxLayout *)
             this_02.
             super___uniq_ptr_impl<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
             ._M_t.
             super__Tuple_impl<0UL,_KDReports::PreviewWidgetPrivate_*,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
             .super__Head_base<0UL,_KDReports::PreviewWidgetPrivate_*,_false>._M_head_impl);
  local_58._8_8_ =
       this_02.
       super___uniq_ptr_impl<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_KDReports::PreviewWidgetPrivate_*,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
       .super__Head_base<0UL,_KDReports::PreviewWidgetPrivate_*,_false>._M_head_impl;
  QBoxLayout::addLayout
            ((QLayout *)local_40,
             (int)this_02.
                  super___uniq_ptr_impl<KDReports::PreviewWidgetPrivate,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_KDReports::PreviewWidgetPrivate_*,_std::default_delete<KDReports::PreviewWidgetPrivate>_>
                  .super__Head_base<0UL,_KDReports::PreviewWidgetPrivate_*,_false>._M_head_impl);
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  local_78._8_8_ = PreviewWidget::tableSettingsClicked;
  local_68 = 0;
  type = (ConnectionType)this;
  local_60 = this;
  QObject::
  connect<void(KDReports::PreviewWidget::*)(),KDReports::PreviewDialog::PreviewDialog(KDReports::Report*,QWidget*)::__0>
            ((Object *)local_58,(offset_in_PreviewWidget_to_subr)pPVar4->m_previewWidget,
             (QObject *)PreviewWidget::tableSettingsClicked,
             (anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_58);
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  local_88 = PreviewWidget::linkActivated;
  local_80 = 0;
  local_98 = linkActivated;
  uStack_90 = 0;
  QObject::
  connect<void(KDReports::PreviewWidget::*)(QUrl_const&),void(KDReports::PreviewDialog::*)(QUrl_const&)>
            ((Object *)local_78,(offset_in_PreviewWidget_to_subr)pPVar4->m_previewWidget,
             (Object *)PreviewWidget::linkActivated,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_78);
  pQVar5 = (QDialogButtonBox *)operator_new(0x28);
  QDialogButtonBox::QDialogButtonBox(pQVar5,Horizontal,(QWidget *)this);
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  uVar2 = local_58._8_8_;
  pPVar4->m_buttonBox = pQVar5;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  pQVar5 = pPVar4->m_buttonBox;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)((long)&printWithDialogButton + 4))
  ;
  QBoxLayout::addWidget((QWidget *)uVar2,(int)pQVar5,(QFlags_conflict1 *)0x0);
  pQVar6 = (QPushButton *)operator_new(0x28);
  local_c1 = 1;
  tr(&local_c0,"&Print...",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar6,(QString *)&local_c0,(QWidget *)this);
  local_c1 = 0;
  QString::~QString(&local_c0);
  local_a8 = pQVar6;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  QDialogButtonBox::addButton((QAbstractButton *)pPVar4->m_buttonBox,(ButtonRole)local_a8);
  saveButton = (QPushButton *)QAbstractButton::clicked;
  local_e0 = 0;
  local_d8 = this;
  QObject::
  connect<void(QAbstractButton::*)(bool),KDReports::PreviewDialog::PreviewDialog(KDReports::Report*,QWidget*)::__1>
            (local_d0,(offset_in_QAbstractButton_to_subr)local_a8,
             (QObject *)QAbstractButton::clicked,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  pQVar6 = (QPushButton *)operator_new(0x28);
  QPushButton::QPushButton(pQVar6,(QWidget *)this);
  this_03 = &this->d;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(this_03);
  pPVar4->m_quickPrintButton = pQVar6;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(this_03);
  pQVar1 = (QAbstractButton *)pPVar4->m_buttonBox;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(this_03);
  QDialogButtonBox::addButton(pQVar1,(ButtonRole)pPVar4->m_quickPrintButton);
  pQVar6 = (QPushButton *)operator_new(0x28);
  local_109 = 1;
  tr(&local_108,"&Save...",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar6,(QString *)&local_108,(QWidget *)this);
  local_109 = 0;
  QString::~QString(&local_108);
  local_f0 = pQVar6;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  QDialogButtonBox::addButton((QAbstractButton *)pPVar4->m_buttonBox,(ButtonRole)local_f0);
  cancelButton = (QPushButton *)QAbstractButton::clicked;
  local_128 = 0;
  local_120 = this;
  QObject::
  connect<void(QAbstractButton::*)(bool),KDReports::PreviewDialog::PreviewDialog(KDReports::Report*,QWidget*)::__2>
            (local_118,(offset_in_QAbstractButton_to_subr)local_f0,
             (QObject *)QAbstractButton::clicked,(anon_class_8_1_8991fb9c_for_function)0x0,type);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  pQVar6 = (QPushButton *)operator_new(0x28);
  local_151 = 1;
  tr(&local_150,"Cancel",(char *)0x0,-1);
  QPushButton::QPushButton(pQVar6,(QString *)&local_150,(QWidget *)this);
  local_151 = 0;
  QString::~QString(&local_150);
  local_138 = pQVar6;
  pPVar4 = std::
           unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
           ::operator->(&this->d);
  QDialogButtonBox::addButton((QAbstractButton *)pPVar4->m_buttonBox,(ButtonRole)local_138);
  QObject::connect<void(QAbstractButton::*)(bool),void(QDialog::*)()>
            (local_160,(offset_in_QAbstractButton_to_subr)local_138,
             (Object *)QAbstractButton::clicked,0,type);
  QMetaObject::Connection::~Connection((Connection *)local_160);
  std::
  unique_ptr<KDReports::PreviewDialogPrivate,_std::default_delete<KDReports::PreviewDialogPrivate>_>
  ::operator->(&this->d);
  QWidget::hide();
  return;
}

Assistant:

KDReports::PreviewDialog::PreviewDialog(KDReports::Report *report, QWidget *parent)
    : QDialog(parent)
    , d(new PreviewDialogPrivate(this))
{
    d->m_previewWidget = new KDReports::PreviewWidget(this);
    d->m_previewWidget->setReport(report);
    auto *topLayout = new QVBoxLayout(this);
    topLayout->addWidget(d->m_previewWidget);
    auto *bottomLayout = new QHBoxLayout();
    topLayout->addLayout(bottomLayout);

    connect(d->m_previewWidget, &KDReports::PreviewWidget::tableSettingsClicked, this, [this]() { d->slotTableBreakingDialog(); });
    connect(d->m_previewWidget, &KDReports::PreviewWidget::linkActivated, this, &KDReports::PreviewDialog::linkActivated);

    d->m_buttonBox = new QDialogButtonBox(Qt::Horizontal, this);
    bottomLayout->addWidget(d->m_buttonBox);

    auto *printWithDialogButton = new QPushButton(tr("&Print..."), this);
    d->m_buttonBox->addButton(printWithDialogButton, QDialogButtonBox::ActionRole);
    connect(printWithDialogButton, &QPushButton::clicked, this, [this]() { d->slotPrintWithDialog(); });

    d->m_quickPrintButton = new QPushButton(this); // create it here for the ordering
    d->m_buttonBox->addButton(d->m_quickPrintButton, QDialogButtonBox::ActionRole);

    auto *saveButton = new QPushButton(tr("&Save..."), this);
    d->m_buttonBox->addButton(saveButton, QDialogButtonBox::ActionRole);
    connect(saveButton, &QPushButton::clicked, this, [this]() { d->slotSave(); });

    auto *cancelButton = new QPushButton(tr("Cancel"), this);
    d->m_buttonBox->addButton(cancelButton, QDialogButtonBox::RejectRole);
    connect(cancelButton, &QPushButton::clicked, this, &QDialog::reject);

    d->m_quickPrintButton->hide();
}